

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_TeleportMove(AActor *thing,DVector3 *pos,bool telefrag,bool modifyactor)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  sector_t *newsec;
  FBoundingBox *box;
  ActorFlags2 *other;
  ActorFlags3 *other_00;
  AActor *pAVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool local_469;
  byte local_419;
  TFlags<ActorFlag6,_unsigned_int> local_414;
  TFlags<ActorFlag2,_unsigned_int> local_410;
  undefined4 local_40c;
  TAngle<double> local_408;
  FName local_400;
  TFlags<ActorFlag7,_unsigned_int> local_3fc;
  TFlags<ActorFlag6,_unsigned_int> local_3f8;
  TFlags<ActorFlag3,_unsigned_int> local_3f4;
  TFlags<ActorFlag3,_unsigned_int> local_3f0;
  TFlags<ActorFlag3,_unsigned_int> local_3ec;
  TFlags<ActorFlag4,_unsigned_int> local_3e8;
  TFlags<ActorFlag2,_unsigned_int> local_3e4;
  undefined1 local_3e0 [4];
  undefined1 local_3dc [4];
  TFlags<ActorFlag6,_unsigned_int> local_3d8;
  TFlags<ActorFlag2,_unsigned_int> local_3d4;
  TFlags<ActorFlag2,_unsigned_int> local_3d0;
  TFlags<ActorFlag2,_unsigned_int> local_3cc;
  DObject *local_3c8;
  double blockdist;
  AActor *local_3b8;
  AActor *th;
  CheckResult cres2;
  FMultiBlockThingsIterator mit2;
  CheckResult cres;
  FMultiBlockLinesIterator mit;
  FPortalGroupArray grouplist;
  sector_t_conflict *sector;
  double savedz;
  byte local_d5;
  bool StompAlwaysFrags;
  sector_t *local_c8;
  sector_t_conflict *oldsec;
  FCheckPosition tmf;
  bool modifyactor_local;
  bool telefrag_local;
  DVector3 *pos_local;
  AActor *thing_local;
  
  tmf.PushTime._2_1_ = modifyactor;
  tmf.PushTime._3_1_ = telefrag;
  FCheckPosition::FCheckPosition((FCheckPosition *)&oldsec,false);
  local_c8 = thing->Sector;
  oldsec = (sector_t_conflict *)thing;
  TVector3<double>::operator=((TVector3<double> *)&tmf,pos);
  tmf.ceilingsector._0_1_ = 0;
  tmf.ceilingsector._1_1_ = 0;
  P_GetFloorCeilingZ((FCheckPosition *)&oldsec,0);
  TArray<spechit_t,_spechit_t>::Clear(&spechit);
  iVar1 = (int)thing;
  TFlags<ActorFlag2,_unsigned_int>::operator&
            ((TFlags<ActorFlag2,_unsigned_int> *)((long)&savedz + 4),
             iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&savedz + 4));
  if (((uVar3 != 0) || ((level.flags & 0x400) != 0)) ||
     (local_419 = 0, (tmf.PushTime._3_1_ & 1) != 0)) {
    TFlags<ActorFlag7,_unsigned_int>::operator&
              ((TFlags<ActorFlag7,_unsigned_int> *)&savedz,
               iVar1 + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG)
              );
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&savedz);
    local_419 = uVar3 != 0 ^ 0xff;
  }
  local_d5 = local_419 & 1;
  dVar5 = AActor::Z(thing);
  AActor::SetZ(thing,pos->Z,true);
  TVector2<double>::TVector2((TVector2<double> *)&grouplist.data.Most,pos);
  newsec = P_PointInSector((DVector2 *)&grouplist.data.Most);
  FPortalGroupArray::FPortalGroupArray((FPortalGroupArray *)(mit.bbox.m_Box + 3),1);
  FMultiBlockLinesIterator::FMultiBlockLinesIterator
            ((FMultiBlockLinesIterator *)&cres.portalflags,(FPortalGroupArray *)(mit.bbox.m_Box + 3)
             ,pos->X,pos->Y,pos->Z,thing->Height,thing->radius,newsec);
  FMultiBlockLinesIterator::CheckResult::CheckResult((CheckResult *)(mit2.bbox.m_Box + 3));
  while (bVar2 = FMultiBlockLinesIterator::Next
                           ((FMultiBlockLinesIterator *)&cres.portalflags,
                            (CheckResult *)(mit2.bbox.m_Box + 3)), bVar2) {
    box = FMultiBlockLinesIterator::Box((FMultiBlockLinesIterator *)&cres.portalflags);
    PIT_FindFloorCeiling
              ((FMultiBlockLinesIterator *)&cres.portalflags,(CheckResult *)(mit2.bbox.m_Box + 3),
               box,(FCheckPosition *)&oldsec,0);
  }
  AActor::SetZ(thing,dVar5,true);
  if (((byte)tmf.ceilingsector & 1) != 0) {
    tmf.ceilingz = (double)tmf.sector;
  }
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            ((FMultiBlockThingsIterator *)&cres2.portalflags,
             (FPortalGroupArray *)(mit.bbox.m_Box + 3),pos->X,pos->Y,pos->Z,thing->Height,
             thing->radius,false,newsec);
  FMultiBlockThingsIterator::CheckResult::CheckResult((CheckResult *)&th);
LAB_0057b58f:
  do {
    do {
      do {
        do {
          bVar2 = FMultiBlockThingsIterator::Next
                            ((FMultiBlockThingsIterator *)&cres2.portalflags,(CheckResult *)&th);
          if (!bVar2) {
            if ((tmf.PushTime._2_1_ & 1) != 0) {
              AActor::SetOrigin(thing,pos,false);
              thing->floorz = (double)tmf.sector;
              thing->ceilingz = tmf.floorz;
              thing->floorsector = (sector_t *)tmf._64_8_;
              (thing->floorpic).texnum = tmf.dropoffz._0_4_;
              thing->floorterrain = tmf.dropoffz._4_4_;
              thing->ceilingsector = (sector_t *)tmf._80_8_;
              (thing->ceilingpic).texnum = (int)tmf.floorsector;
              thing->dropoffz = tmf.ceilingz;
              thing->BlockingLine = (line_t *)0x0;
              TFlags<ActorFlag2,_unsigned_int>::operator&
                        (&local_410,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
              uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_410);
              if (uVar3 != 0) {
                AActor::AdjustFloorClip(thing);
              }
              pAVar4 = TObjPtr::operator_cast_to_AActor_
                                 ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
              if (thing == pAVar4) {
                R_ResetViewInterpolation();
              }
              TFlags<ActorFlag6,_unsigned_int>::operator&
                        (&local_414,
                         iVar1 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
              uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_414);
              if (uVar3 == 0 && (i_compatflags2 & 0x20U) == 0) {
                AActor::CheckSectorTransition(thing,local_c8);
              }
            }
            thing_local._7_1_ = true;
LAB_0057bd2c:
            local_40c = 1;
            FMultiBlockThingsIterator::~FMultiBlockThingsIterator
                      ((FMultiBlockThingsIterator *)&cres2.portalflags);
            FPortalGroupArray::~FPortalGroupArray((FPortalGroupArray *)(mit.bbox.m_Box + 3));
            FCheckPosition::~FCheckPosition((FCheckPosition *)&oldsec);
            return thing_local._7_1_;
          }
          local_3b8 = th;
          TFlags<ActorFlag,_unsigned_int>::operator&
                    ((TFlags<ActorFlag,_unsigned_int> *)((long)&blockdist + 4),
                     (int)th + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                               MF_SHOOTABLE));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&blockdist + 4));
        } while ((uVar3 == 0) || (local_3b8 == thing));
        local_3c8 = (DObject *)(local_3b8->radius + oldsec->interpolations[1].field_0);
        dVar5 = AActor::X(local_3b8);
      } while (((double)local_3c8 <= ABS(dVar5 - (double)cres2.thing)) ||
              (dVar5 = AActor::Y(local_3b8), (double)local_3c8 <= ABS(dVar5 - cres2.Position.X)));
      other = &local_3b8->flags2;
      TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_3d4,(Self *)&oldsec->touching_thinglist);
      TFlags<ActorFlag2,_unsigned_int>::operator|(&local_3d0,other);
      TFlags<ActorFlag2,_unsigned_int>::operator&(&local_3cc,(ActorFlag2)&local_3d0);
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3cc);
    } while (uVar3 != 0);
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_3d8,
               (int)oldsec + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3d8);
    local_469 = false;
    if (uVar3 != 0) {
      AActor::GetSpecies((AActor *)local_3dc);
      AActor::GetSpecies((AActor *)local_3e0);
      local_469 = FName::operator==((FName *)local_3dc,(FName *)local_3e0);
    }
  } while (local_469 != false);
  TFlags<ActorFlag2,_unsigned_int>::operator&
            (&local_3e4,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3e4);
  if (uVar3 == 0) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_3e8,
               (int)local_3b8 +
               (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3e8);
    bVar2 = false;
    if (uVar3 != 0) goto LAB_0057b8aa;
  }
  else {
LAB_0057b8aa:
    bVar2 = (i_compatflags & 0x10U) == 0;
  }
  if (bVar2) {
    other_00 = &local_3b8->flags3;
    TFlags<ActorFlag3,_unsigned_int>::TFlags(&local_3f4,&thing->flags3);
    TFlags<ActorFlag3,_unsigned_int>::operator&(&local_3f0,other_00);
    TFlags<ActorFlag3,_unsigned_int>::operator&(&local_3ec,(ActorFlag3)&local_3f0);
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3ec);
    if ((uVar3 == 0) &&
       ((dVar5 = pos->Z, dVar6 = AActor::Top(local_3b8), dVar6 < dVar5 ||
        (dVar5 = pos->Z, dVar6 = thing->Height, dVar7 = AActor::Z(local_3b8), dVar5 + dVar6 < dVar7)
        ))) goto LAB_0057b58f;
  }
  if ((local_d5 & 1) == 0) {
LAB_0057ba45:
    TFlags<ActorFlag7,_unsigned_int>::operator&
              (&local_3fc,
               (int)local_3b8 +
               (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3fc);
    bVar2 = uVar3 != 0;
  }
  else {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_3f8,
               (int)local_3b8 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3f8);
    bVar2 = true;
    if (uVar3 != 0) goto LAB_0057ba45;
  }
  pAVar4 = local_3b8;
  if (!bVar2) {
    thing_local._7_1_ = false;
    goto LAB_0057bd2c;
  }
  if ((thing->player == (player_t *)0x0) || ((thing->player->cheats & 0x2000U) == 0)) {
    FName::FName(&local_400,NAME_Telefrag);
    TAngle<double>::TAngle(&local_408,0.0);
    P_DamageMobj(pAVar4,thing,thing,1000000,&local_400,4,&local_408);
  }
  goto LAB_0057b58f;
}

Assistant:

bool	P_TeleportMove(AActor* thing, const DVector3 &pos, bool telefrag, bool modifyactor) 
{
	FCheckPosition tmf;
	sector_t *oldsec = thing->Sector;

	// kill anything occupying the position


	// The base floor/ceiling is from the subsector that contains the point.
	// Any contacted lines the step closer together will adjust them.
	tmf.thing = thing;
	tmf.pos = pos;
	tmf.touchmidtex = false;
	tmf.abovemidtex = false;
	P_GetFloorCeilingZ(tmf, 0);

	spechit.Clear();	// this is needed so that no more specials get activated after crossing a teleporter.

	bool StompAlwaysFrags = ((thing->flags2 & MF2_TELESTOMP) || (level.flags & LEVEL_MONSTERSTELEFRAG) || telefrag) && !(thing->flags7 & MF7_NOTELESTOMP);

	// P_LineOpening requires the thing's z to be the destination z in order to work.
	double savedz = thing->Z();
	thing->SetZ(pos.Z);
	sector_t *sector = P_PointInSector(pos);

	FPortalGroupArray grouplist;
	FMultiBlockLinesIterator mit(grouplist, pos.X, pos.Y, pos.Z, thing->Height, thing->radius, sector);
	FMultiBlockLinesIterator::CheckResult cres;

	while (mit.Next(&cres))
	{
		PIT_FindFloorCeiling(mit, cres, mit.Box(), tmf, 0);
	}
	thing->SetZ(savedz);

	if (tmf.touchmidtex) tmf.dropoffz = tmf.floorz;

	FMultiBlockThingsIterator mit2(grouplist, pos.X, pos.Y, pos.Z, thing->Height, thing->radius, false, sector);
	FMultiBlockThingsIterator::CheckResult cres2;

	while (mit2.Next(&cres2))
	{
		AActor *th = cres2.thing;

		if (!(th->flags & MF_SHOOTABLE))
			continue;

		// don't clip against self
		if (th == thing)
			continue;

		double blockdist = th->radius + tmf.thing->radius;
		if (fabs(th->X() - cres2.Position.X) >= blockdist || fabs(th->Y() - cres2.Position.Y) >= blockdist)
			continue;

		if ((th->flags2 | tmf.thing->flags2) & MF2_THRUACTORS)
			continue;

		if (tmf.thing->flags6 & MF6_THRUSPECIES && tmf.thing->GetSpecies() == th->GetSpecies())
			continue;

		// [RH] Z-Check
		// But not if not MF2_PASSMOBJ or MF3_DONTOVERLAP are set!
		// Otherwise those things would get stuck inside each other.
		if ((thing->flags2 & MF2_PASSMOBJ || th->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
		{
			if (!(th->flags3 & thing->flags3 & MF3_DONTOVERLAP))
			{
				if (pos.Z > th->Top() ||	// overhead
					pos.Z + thing->Height < th->Z())	// underneath
					continue;
			}
		}

		// monsters don't stomp things except on boss level
		// [RH] Some Heretic/Hexen monsters can telestomp
		// ... and some items can never be telefragged while others will be telefragged by everything that teleports upon them.
		if ((StompAlwaysFrags && !(th->flags6 & MF6_NOTELEFRAG)) || (th->flags7 & MF7_ALWAYSTELEFRAG))
		{
			// Don't actually damage if predicting a teleport
			if (thing->player == NULL || !(thing->player->cheats & CF_PREDICTING))
				P_DamageMobj(th, thing, thing, TELEFRAG_DAMAGE, NAME_Telefrag, DMG_THRUSTLESS);
			continue;
		}
		return false;
	}

	if (modifyactor)
	{
		// the move is ok, so link the thing into its new position
		thing->SetOrigin(pos, false);
		thing->floorz = tmf.floorz;
		thing->ceilingz = tmf.ceilingz;
		thing->floorsector = tmf.floorsector;
		thing->floorpic = tmf.floorpic;
		thing->floorterrain = tmf.floorterrain;
		thing->ceilingsector = tmf.ceilingsector;
		thing->ceilingpic = tmf.ceilingpic;
		thing->dropoffz = tmf.dropoffz;        // killough 11/98
		thing->BlockingLine = NULL;

		if (thing->flags2 & MF2_FLOORCLIP)
		{
			thing->AdjustFloorClip();
		}

		if (thing == players[consoleplayer].camera)
		{
			R_ResetViewInterpolation();
		}

		// If this teleport was caused by a move, P_TryMove() will handle the
		// sector transition messages better than we can here.
		// This needs to be compatibility optioned because some older maps exploited this missing feature.
		if (!(thing->flags6 & MF6_INTRYMOVE) && !(i_compatflags2 & COMPATF2_TELEPORT))
		{
			thing->CheckSectorTransition(oldsec);
		}
	}

	return true;
}